

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_info.c
# Opt level: O2

size_t ht_system_info_push_endianness_info_to_listener
                 (HT_TimelineListenerCallback callback,void *listener,HT_Boolean serialize)

{
  size_t sVar1;
  HT_Byte buffer [64];
  HT_Event local_88;
  undefined1 local_70;
  HT_Byte local_68 [64];
  
  local_88.klass = ht_HT_EndiannessInfoEvent_get_event_klass_instance();
  local_88.timestamp = 0;
  local_88.id = 0;
  local_70 = 0;
  sVar1 = ht_event_utils_serialize_event_to_buffer(&local_88,local_68,serialize);
  (*callback)(local_68,sVar1,serialize,listener);
  return sVar1;
}

Assistant:

size_t
ht_system_info_push_endianness_info_to_listener(HT_TimelineListenerCallback callback, void* listener, HT_Boolean serialize)
{
    size_t data_size;
    HT_DECL_EVENT(HT_EndiannessInfoEvent, event);
    event.base.id = event.base.timestamp = 0;
    event.endianness = (uint8_t) ht_system_info_get_endianness();

    HT_Byte buffer[64];

    data_size = ht_event_utils_serialize_event_to_buffer(HT_EVENT(&event), buffer, serialize);

    callback(buffer, data_size, serialize, listener);

    return data_size;
}